

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLD1LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar2;
  uint32_t uVar3;
  uint RegNo_01;
  DecodeStatus DVar4;
  uint Rd;
  uint Rm;
  uint Rn;
  uint index;
  uint align;
  uint size;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  align = 3;
  Rn = 0;
  _size = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0x10,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  RegNo_01 = uVar2 | uVar3 << 4;
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,10,2);
  if (uVar2 == 0) {
    uVar2 = fieldFromInstruction_4(Address_local._4_4_,4,1);
    if (uVar2 != 0) {
      return MCDisassembler_Fail;
    }
    Rm = fieldFromInstruction_4(Address_local._4_4_,5,3);
  }
  else if (uVar2 == 1) {
    uVar2 = fieldFromInstruction_4(Address_local._4_4_,5,1);
    if (uVar2 != 0) {
      return MCDisassembler_Fail;
    }
    Rm = fieldFromInstruction_4(Address_local._4_4_,6,2);
    uVar2 = fieldFromInstruction_4(Address_local._4_4_,4,1);
    if (uVar2 != 0) {
      Rn = 2;
    }
  }
  else {
    if (uVar2 != 2) {
      return MCDisassembler_Fail;
    }
    uVar2 = fieldFromInstruction_4(Address_local._4_4_,6,1);
    if (uVar2 != 0) {
      return MCDisassembler_Fail;
    }
    Rm = fieldFromInstruction_4(Address_local._4_4_,7,1);
    uVar2 = fieldFromInstruction_4(Address_local._4_4_,4,2);
    if (uVar2 == 0) {
      Rn = 0;
    }
    else {
      if (uVar2 != 3) {
        return MCDisassembler_Fail;
      }
      Rn = 4;
    }
  }
  DVar4 = DecodeDPRRegisterClass(pMStack_18,RegNo_01,(uint64_t)Decoder_local,_size);
  _Var1 = Check(&align,DVar4);
  if (_Var1) {
    if (RegNo_00 != 0xf) {
      DVar4 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_size);
      _Var1 = Check(&align,DVar4);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar4 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_size);
    _Var1 = Check(&align,DVar4);
    if (_Var1) {
      MCOperand_CreateImm0(pMStack_18,(ulong)Rn);
      if (RegNo_00 != 0xf) {
        if (RegNo_00 == 0xd) {
          MCOperand_CreateReg0(pMStack_18,0);
        }
        else {
          DVar4 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_size);
          _Var1 = Check(&align,DVar4);
          if (!_Var1) {
            return MCDisassembler_Fail;
          }
        }
      }
      DVar4 = DecodeDPRRegisterClass(pMStack_18,RegNo_01,(uint64_t)Decoder_local,_size);
      _Var1 = Check(&align,DVar4);
      if (_Var1) {
        MCOperand_CreateImm0(pMStack_18,(ulong)Rm);
        Inst_local._4_4_ = align;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVLD1LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 5, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 6, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);

			switch (fieldFromInstruction_4(Insn, 4, 2)) {
				case 0 :
					align = 0; break;
				case 3:
					align = 4; break;
				default:
					return MCDisassembler_Fail;
			}
			break;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}